

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O2

void __thiscall
Eigen::TriangularBase<Eigen::SelfAdjointView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u>>::
evalToLazy<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (TriangularBase<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>> *this
          ,MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other,
             *(Index *)(*(long *)this + 8),*(Index *)(*(long *)this + 0x10));
  internal::
  call_triangular_assignment_loop<17,false,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)other,*(Matrix<double,__1,__1,_0,__1,__1> **)this)
  ;
  return;
}

Assistant:

void TriangularBase<Derived>::evalToLazy(MatrixBase<DenseDerived> &other) const
{
  other.derived().resize(this->rows(), this->cols());
  internal::call_triangular_assignment_loop<Derived::Mode,(Derived::Mode&SelfAdjoint)==0 /* SetOpposite */>(other.derived(), derived().nestedExpression());
}